

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

parser * init_parse_artifact_set(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"set-name str name",parse_artifact_set_name);
  parser_reg(p,"number int number",parse_artifact_set_number);
  parser_reg(p,"desc str text",parse_artifact_set_desc);
  parser_reg(p,"artifact-name str name",parse_artifact_set_artifact_name);
  parser_reg(p,"flags ?str flags",parse_artifact_set_flags);
  parser_reg(p,"values str values",parse_artifact_set_values);
  parser_reg(p,"slay str code",parse_artifact_set_slay);
  parser_reg(p,"brand str code",parse_artifact_set_brand);
  return p;
}

Assistant:

static struct parser *init_parse_artifact_set(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "set-name str name", parse_artifact_set_name);
	parser_reg(p, "number int number", parse_artifact_set_number);
	parser_reg(p, "desc str text", parse_artifact_set_desc);
	parser_reg(p, "artifact-name str name", parse_artifact_set_artifact_name);
	parser_reg(p, "flags ?str flags", parse_artifact_set_flags);
	parser_reg(p, "values str values", parse_artifact_set_values);
	parser_reg(p, "slay str code", parse_artifact_set_slay);
	parser_reg(p, "brand str code", parse_artifact_set_brand);
	return p;
}